

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O2

void indexed12_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  uint8_t *puVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  long lVar6;
  cs_m680x_op *op;
  byte bVar7;
  
  bVar2 = (info->m680x).op_count;
  (info->m680x).op_count = bVar2 + 1;
  op = (info->m680x).operands + bVar2;
  uVar4 = *address;
  *address = uVar4 + 1;
  lVar6 = (ulong)uVar4 - (ulong)info->offset;
  if ((uint)lVar6 < info->size) {
    bVar7 = info->code[lVar6];
  }
  else {
    bVar7 = 0;
  }
  op->type = M680X_OP_INDEXED;
  set_operand_size(info,op,(uint8_t)address);
  (info->m680x).operands[bVar2].field_1.idx.offset_reg = M680X_REG_INVALID;
  if ((bVar7 & 0x20) == 0) {
    (info->m680x).operands[bVar2].field_1.imm = g_idx12_to_reg_ids[bVar7 >> 6];
    uVar4 = bVar7 | 0xfff0;
    if ((bVar7 & 0x10) == 0) {
      uVar4 = bVar7 & 0xf;
    }
    (info->m680x).operands[bVar2].field_1.idx.offset = uVar4;
    (info->m680x).operands[bVar2].field_1.idx.offset_addr = uVar4 + *address;
    (info->m680x).operands[bVar2].field_1.idx.offset_bits = '\x05';
  }
  else {
    uVar5 = (uint)bVar7;
    if ((~uVar5 & 0xe0) == 0) {
      (info->m680x).operands[bVar2].field_1.imm =
           *(int32_t *)((long)g_idx12_to_reg_ids + (ulong)(bVar7 >> 1 & 0xc));
    }
    switch(uVar5 & 0xffffffe7) {
    case 0xe0:
    case 0xe1:
      uVar4 = *address;
      *address = uVar4 + 1;
      lVar6 = (ulong)uVar4 - (ulong)info->offset;
      if ((uint)lVar6 < info->size) {
        uVar4 = (ushort)info->code[lVar6];
      }
      else {
        uVar4 = 0;
      }
      if ((bVar7 & 1) != 0) {
        uVar4 = uVar4 - 0x100;
      }
      (info->m680x).operands[bVar2].field_1.idx.offset = uVar4;
      (info->m680x).operands[bVar2].field_1.idx.offset_bits = '\t';
      if ((info->m680x).operands[bVar2].field_1.imm == 0x13) {
        (info->m680x).operands[bVar2].field_1.idx.offset_addr = uVar4 + *address;
      }
      break;
    case 0xe3:
      puVar1 = &(info->m680x).operands[bVar2].field_1.idx.flags;
      *puVar1 = *puVar1 | 1;
    case 0xe2:
      read_word(info,(uint16_t *)&(info->m680x).operands[bVar2].field_1.idx.offset,*address);
      *address = *address + 2;
      (info->m680x).operands[bVar2].field_1.idx.offset_bits = '\x10';
      if ((info->m680x).operands[bVar2].field_1.imm == 0x13) {
        (info->m680x).operands[bVar2].field_1.idx.offset_addr =
             *address + (info->m680x).operands[bVar2].field_1.idx.offset;
      }
      break;
    case 0xe4:
    case 0xe5:
    case 0xe6:
      (info->m680x).operands[bVar2].field_1.idx.offset_reg = g_or12_to_reg_ids[uVar5 & 3];
      break;
    case 0xe7:
      (info->m680x).operands[bVar2].field_1.idx.offset_reg = M680X_REG_D;
      puVar1 = &(info->m680x).operands[bVar2].field_1.idx.flags;
      *puVar1 = *puVar1 | 1;
      break;
    default:
      (info->m680x).operands[bVar2].field_1.imm = g_idx12_to_reg_ids[bVar7 >> 6];
      bVar3 = bVar7 & 0xf;
      (info->m680x).operands[bVar2].field_1.idx.inc_dec =
           ((bVar3 < 8) << 4 | bVar3) + (bVar3 < 8) + -0x10;
      if ((bVar7 & 0x10) != 0) {
        puVar1 = &(info->m680x).operands[bVar2].field_1.idx.flags;
        *puVar1 = *puVar1 | 4;
      }
    }
  }
  return;
}

Assistant:

static void indexed12_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	cs_m680x *m680x = &info->m680x;
	cs_m680x_op *op = &m680x->operands[m680x->op_count++];
	uint8_t post_byte = 0;
	uint8_t offset8 = 0;

	read_byte(info, &post_byte, (*address)++);

	op->type = M680X_OP_INDEXED;
	set_operand_size(info, op, 1);
	op->idx.offset_reg = M680X_REG_INVALID;

	if (!(post_byte & 0x20)) {
		// n5,R      n5 is a 5-bit signed offset
		op->idx.base_reg = g_idx12_to_reg_ids[(post_byte >> 6) & 0x03];

		if ((post_byte & 0x10) == 0x10)
			op->idx.offset = post_byte | 0xfff0;
		else
			op->idx.offset = post_byte & 0x0f;

		op->idx.offset_addr = op->idx.offset + *address;
		op->idx.offset_bits = M680X_OFFSET_BITS_5;
	}
	else {
		if ((post_byte & 0xe0) == 0xe0)
			op->idx.base_reg =
				g_idx12_to_reg_ids[(post_byte >> 3) & 0x03];

		switch (post_byte & 0xe7) {
		case 0xe0:
		case 0xe1: // n9,R
			read_byte(info, &offset8, (*address)++);
			op->idx.offset = offset8;

			if (post_byte & 0x01) // sign extension
				op->idx.offset |= 0xff00;

			op->idx.offset_bits = M680X_OFFSET_BITS_9;

			if (op->idx.base_reg == M680X_REG_PC)
				op->idx.offset_addr = op->idx.offset + *address;

			break;

		case 0xe3: // [n16,R]
			op->idx.flags |= M680X_IDX_INDIRECT;

		// intentionally fall through
		case 0xe2: // n16,R
			read_word(info, (uint16_t *)&op->idx.offset, *address);
			(*address) += 2;
			op->idx.offset_bits = M680X_OFFSET_BITS_16;

			if (op->idx.base_reg == M680X_REG_PC)
				op->idx.offset_addr = op->idx.offset + *address;

			break;

		case 0xe4: // A,R
		case 0xe5: // B,R
		case 0xe6: // D,R
			op->idx.offset_reg =
				g_or12_to_reg_ids[post_byte & 0x03];
			break;

		case 0xe7: // [D,R]
			op->idx.offset_reg = M680X_REG_D;
			op->idx.flags |= M680X_IDX_INDIRECT;
			break;

		default: // n,-r n,+r n,r- n,r+
			// PC is not allowed in this mode
			op->idx.base_reg =
				g_idx12_to_reg_ids[(post_byte >> 6) & 0x03];
			op->idx.inc_dec = post_byte & 0x0f;

			if (op->idx.inc_dec & 0x08) // evtl. sign extend value
				op->idx.inc_dec |= 0xf0;

			if (op->idx.inc_dec >= 0)
				op->idx.inc_dec++;

			if (post_byte & 0x10)
				op->idx.flags |= M680X_IDX_POST_INC_DEC;

			break;

		}
	}
}